

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::post_timestep(PeleLM *this,int crse_iteration)

{
  int iVar1;
  FabArrayBase *this_00;
  type pMVar2;
  MultiFab *S_fine;
  long in_RDI;
  MultiFab *Ydot_fine;
  MultiFab *Ydot_crse;
  PeleLM *flev;
  PeleLM *clev;
  int i_1;
  int i;
  Real factor;
  int Ndiag;
  int in_stack_000003dc;
  NavierStokesBase *in_stack_000003e0;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  PeleLM *in_stack_fffffffffffffe90;
  NavierStokesBase *this_01;
  key_type *in_stack_fffffffffffffec8;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *in_stack_fffffffffffffed0;
  allocator local_e9;
  string local_e8 [32];
  PeleLM *local_c8;
  undefined1 local_b9 [33];
  type local_98;
  PeleLM *local_90;
  PeleLM *local_88;
  int local_80;
  allocator local_79;
  string local_78 [36];
  int local_54;
  double local_50;
  allocator local_31;
  string local_30 [32];
  int local_10;
  
  NavierStokesBase::post_timestep(in_stack_000003e0,in_stack_000003dc);
  if (((plot_reactions & 1U) != 0) && (*(int *)(in_RDI + 8) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"REACTIONS",&local_31);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
    ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    this_00 = (FabArrayBase *)
              std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         0x4f08e4);
    iVar1 = amrex::FabArrayBase::nComp(this_00);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_50 = 1.0 / (anonymous_namespace)::crse_dt;
    local_10 = iVar1;
    for (local_54 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150)); -1 < local_54;
        local_54 = local_54 + -1) {
      getLevel(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"REACTIONS",&local_79);
      in_stack_fffffffffffffed0 =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x4f09c6);
      amrex::MultiFab::mult
                ((MultiFab *)in_stack_fffffffffffffe90,
                 (Real)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    for (local_80 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150)); 0 < local_80;
        local_80 = local_80 + -1) {
      local_88 = getLevel(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      local_90 = getLevel(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      __k = (key_type *)local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_b9 + 1),"REACTIONS",(allocator *)__k);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
      ::operator[](in_stack_fffffffffffffed0,__k);
      pMVar2 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                         ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffffe90);
      std::__cxx11::string::~string((string *)(local_b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b9);
      this_01 = (NavierStokesBase *)&local_90->auxDiag;
      local_98 = pMVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"REACTIONS",&local_e9);
      S_fine = (MultiFab *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[](in_stack_fffffffffffffed0,__k);
      in_stack_fffffffffffffe90 =
           (PeleLM *)
           std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      local_c8 = in_stack_fffffffffffffe90;
      NavierStokesBase::average_down
                (this_01,S_fine,(MultiFab *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                 in_stack_fffffffffffffe88);
    }
  }
  return;
}

Assistant:

void
PeleLM::post_timestep (int crse_iteration)
{
  BL_PROFILE("PLM::post_timestep()");

  NavierStokesBase::post_timestep(crse_iteration);

  if (plot_reactions && level == 0)
  {
    const int Ndiag = auxDiag["REACTIONS"]->nComp();
    //
    // Multiply by the inverse of the coarse timestep.
    //
    const Real factor = 1.0 / crse_dt;

    for (int i = parent->finestLevel(); i >= 0; --i)
      getLevel(i).auxDiag["REACTIONS"]->mult(factor);

    for (int i = parent->finestLevel(); i > 0; --i)
    {
      PeleLM& clev = getLevel(i-1);
      PeleLM& flev = getLevel(i);

      MultiFab& Ydot_crse = *(clev.auxDiag["REACTIONS"]);
      MultiFab& Ydot_fine = *(flev.auxDiag["REACTIONS"]);

      clev.average_down(Ydot_fine, Ydot_crse, 0, Ndiag);
    }
  }
}